

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O0

YSRESULT __thiscall YsSoundPlayer::SoundData::ConvertTo8Bit(SoundData *this)

{
  uchar *puVar1;
  uint local_24;
  int i;
  uchar *newDat;
  SoundData *this_local;
  
  if (this->bit == 8) {
    this_local._4_4_ = YSOK;
  }
  else if (this->bit == 0x10) {
    puVar1 = (uchar *)operator_new__((ulong)(this->sizeInBytes >> 1));
    for (local_24 = 0; local_24 < this->sizeInBytes; local_24 = local_24 + 2) {
      puVar1[(int)local_24 / 2] = this->dat[(int)local_24];
    }
    if (this->dat != (uchar *)0x0) {
      operator_delete__(this->dat);
    }
    this->dat = puVar1;
    this->bit = 8;
    this->sizeInBytes = this->sizeInBytes >> 1;
    this_local._4_4_ = YSOK;
  }
  else {
    this_local._4_4_ = YSERR;
  }
  return this_local._4_4_;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::ConvertTo8Bit(void)
{
	if(bit==8)
	{
		return YSOK;
	}
	else if(bit==16)
	{
		unsigned char *newDat=new unsigned char [sizeInBytes/2];
		for(int i=0; i<sizeInBytes; i+=2)
		{
			newDat[i/2]=dat[i];
		}
		delete [] dat;
		dat=newDat;
		bit=8;
		sizeInBytes/=2;
		return YSOK;
	}
	return YSERR;
}